

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_pre_shared_key(void)

{
  char *_name_5;
  char *_name_4;
  char *_name_3;
  char *_name_2;
  char *_name_1;
  char *_name;
  
  if (ctx == ctx_peer) {
    enter_subtest("key-share:no");
    do_test_pre_shared_key(0);
    exit_subtest("key-share:no");
    enter_subtest("key-share:yes");
    do_test_pre_shared_key(1);
    exit_subtest("key-share:yes");
    enter_subtest("key-share:server-wo-key-share");
    do_test_pre_shared_key(2);
    exit_subtest("key-share:server-wo-key-share");
    enter_subtest("key-share:mismatch");
    do_test_pre_shared_key(3);
    exit_subtest("key-share:mismatch");
    enter_subtest("key-share:negotiate");
    do_test_pre_shared_key(4);
    exit_subtest("key-share:negotiate");
    enter_subtest("fail:requires-psk-dhe");
    do_test_pre_shared_key(-1);
    exit_subtest("fail:requires-psk-dhe");
  }
  else {
    note("psk tests use `ctx` only");
  }
  return;
}

Assistant:

static void test_pre_shared_key(void)
{
    if (ctx != ctx_peer) {
        note("psk tests use `ctx` only");
        return;
    }

    subtest("key-share:no", do_test_pre_shared_key, 0);
    subtest("key-share:yes", do_test_pre_shared_key, 1);
    subtest("key-share:server-wo-key-share", do_test_pre_shared_key, 2);
    subtest("key-share:mismatch", do_test_pre_shared_key, 3);
    subtest("key-share:negotiate", do_test_pre_shared_key, 4);

    subtest("fail:requires-psk-dhe", do_test_pre_shared_key, -1);
}